

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_impl.cpp
# Opt level: O0

MPP_RET rc_brief_get_all(RcApiQueryAll *query)

{
  uint max_count_00;
  RcApiBrief *brief_00;
  RcImplApiService *this;
  RK_S32 max_count;
  RK_S32 *count;
  RcApiBrief *brief;
  RcApiQueryAll *query_local;
  
  if (query == (RcApiQueryAll *)0x0) {
    _mpp_log_l(2,"rc_impl","invalide NULL query input\n","rc_brief_get_all");
    query_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    brief_00 = query->brief;
    max_count_00 = query->max_count;
    if ((brief_00 == (RcApiBrief *)0x0) || ((int)max_count_00 < 1)) {
      _mpp_log_l(2,"rc_impl","invalide brief buffer %p max count %d\n","rc_brief_get_all",brief_00,
                 (ulong)max_count_00);
      query_local._4_4_ = MPP_NOK;
    }
    else {
      this = RcImplApiService::get_instance();
      query_local._4_4_ = RcImplApiService::api_get_all(this,brief_00,&query->count,max_count_00);
    }
  }
  return query_local._4_4_;
}

Assistant:

MPP_RET rc_brief_get_all(RcApiQueryAll *query)
{
    if (NULL == query) {
        mpp_err_f("invalide NULL query input\n");
        return MPP_ERR_NULL_PTR;
    }

    RcApiBrief *brief = query->brief;
    RK_S32 *count = &query->count;
    RK_S32 max_count = query->max_count;

    if (NULL == brief || max_count <= 0) {
        mpp_err_f("invalide brief buffer %p max count %d\n", brief, max_count);
        return MPP_NOK;
    }

    return RcImplApiService::get_instance()->api_get_all(brief, count, max_count);
}